

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysAllocService.cpp
# Opt level: O2

void anon_unknown.dwarf_52656a::sysalloc_initialize(Caliper *c,Channel *chn)

{
  Events *pEVar1;
  ostream *poVar2;
  string sStack_278;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  Log local_218;
  
  pEVar1 = cali::Channel::events(chn);
  local_238._M_unused._M_object = (void *)0x0;
  local_238._8_8_ = 0;
  local_220 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/services/sysalloc/SysAllocService.cpp:170:41)>
              ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/services/sysalloc/SysAllocService.cpp:170:41)>
              ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar1->post_init_evt).mCb,(value_type *)&local_238);
  std::_Function_base::~_Function_base((_Function_base *)&local_238);
  pEVar1 = cali::Channel::events(chn);
  local_258._M_unused._M_object = (void *)0x0;
  local_258._8_8_ = 0;
  local_240 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/services/sysalloc/SysAllocService.cpp:177:42)>
              ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/services/sysalloc/SysAllocService.cpp:177:42)>
              ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar1->pre_finish_evt).mCb,(value_type *)&local_258);
  std::_Function_base::~_Function_base((_Function_base *)&local_258);
  std::ofstream::ofstream(&local_218);
  local_218.m_level = 1;
  poVar2 = cali::Log::stream(&local_218);
  cali::Channel::name_abi_cxx11_(&sStack_278,chn);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_278);
  poVar2 = std::operator<<(poVar2,": Registered sysalloc service");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&sStack_278);
  std::ofstream::~ofstream(&local_218);
  return;
}

Assistant:

void sysalloc_initialize(Caliper* c, Channel* chn)
{
    chn->events().post_init_evt.connect([](Caliper* c, Channel* chn) {
        if (!bindings_are_active)
            init_alloc_hooks();

        ChannelList::add(&sysalloc_channels, *chn);
    });

    chn->events().pre_finish_evt.connect([](Caliper* c, Channel* chn) {
        Log(2).stream() << chn->name() << ": Removing sysalloc hooks" << std::endl;
        ChannelList::remove(&sysalloc_channels, *chn);
    });

    Log(1).stream() << chn->name() << ": Registered sysalloc service" << std::endl;
}